

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O2

string * __thiscall
csv::internals::format_row
          (string *__return_storage_ptr__,internals *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *row,string_view delim)

{
  ulong uVar1;
  long lVar2;
  stringstream ret;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ret);
  lVar2 = 0;
  for (uVar1 = 1; uVar1 - 1 < (ulong)(*(long *)(this + 8) - *(long *)this >> 5); uVar1 = uVar1 + 1)
  {
    std::operator<<(local_1a8,(string *)(*(long *)this + lVar2));
    if (uVar1 < (ulong)(*(long *)(this + 8) - *(long *)this >> 5)) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)delim._M_len,(long)row);
    }
    else {
      std::operator<<(local_1a8,'\n');
    }
    lVar2 = lVar2 + 0x20;
  }
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ret);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::string format_row(const std::vector<std::string>& row, csv::string_view delim) {
            /** Print a CSV row */
            std::stringstream ret;
            for (size_t i = 0; i < row.size(); i++) {
                ret << row[i];
                if (i + 1 < row.size()) ret << delim;
                else ret << '\n';
            }
            ret.flush();

            return ret.str();
        }